

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_proxy_call(JSContext *ctx,JSValue func_obj,JSValue this_obj,int argc,JSValue *argv,
                     int flags)

{
  JSValueUnion *pJVar1;
  ulong uVar2;
  JSValue func_obj_00;
  JSValue func_obj_01;
  JSValue v;
  JSValue func_obj_02;
  JSValue v_00;
  JSValue JVar3;
  JSValue JVar4;
  JSValue JVar5;
  JSValue method;
  JSValueUnion local_68;
  JSValueUnion JStack_60;
  JSValue local_58;
  JSValue local_48;
  
  if ((flags & 1U) == 0) {
    pJVar1 = (JSValueUnion *)get_proxy_method(ctx,&method,func_obj,0x5a);
    if (pJVar1 != (JSValueUnion *)0x0) {
      if (*(uint8_t *)(pJVar1 + 4) != '\0') {
        if ((int)method.tag == 3) {
          JVar3 = JS_Call(ctx,*(JSValue *)pJVar1,this_obj,argc,argv);
          uVar2 = (ulong)JVar3.u.ptr & 0xffffffff00000000;
        }
        else {
          JVar4 = js_create_array(ctx,argc,argv);
          if ((int)JVar4.tag == 6) {
            JVar3 = (JSValue)(ZEXT816(6) << 0x40);
            uVar2 = 0;
          }
          else {
            local_68 = *pJVar1;
            JStack_60 = pJVar1[1];
            func_obj_01.tag = method.tag;
            func_obj_01.u.float64 = method.u.float64;
            local_58 = this_obj;
            local_48 = JVar4;
            JVar3 = JS_Call(ctx,func_obj_01,*(JSValue *)(pJVar1 + 2),3,(JSValue *)&local_68);
            uVar2 = (ulong)JVar3.u.ptr & 0xffffffff00000000;
          }
          v.tag = method.tag;
          v.u.float64 = method.u.float64;
          JS_FreeValue(ctx,v);
          JS_FreeValue(ctx,JVar4);
        }
        goto LAB_001299b8;
      }
      JVar4.tag = method.tag;
      JVar4.u.float64 = method.u.float64;
      JS_FreeValue(ctx,JVar4);
      JS_ThrowTypeError(ctx,"not a function");
    }
    JVar3 = (JSValue)(ZEXT816(6) << 0x40);
    uVar2 = 0;
    goto LAB_001299b8;
  }
  pJVar1 = (JSValueUnion *)get_proxy_method(ctx,&method,func_obj,0x5e);
  if (pJVar1 == (JSValueUnion *)0x0) {
LAB_0012989a:
    JVar4 = (JSValue)(ZEXT816(6) << 0x40);
    uVar2 = 0;
  }
  else {
    if ((pJVar1[1].int32 != -1) || ((*(byte *)((long)pJVar1->ptr + 5) & 0x10) == 0)) {
      JS_ThrowTypeError(ctx,"not a constructor");
      goto LAB_0012989a;
    }
    if ((int)method.tag == 3) {
      func_obj_00.tag = (int64_t)pJVar1[1].ptr;
      func_obj_00.u.ptr = pJVar1->ptr;
      JVar4 = JS_CallConstructor2(ctx,func_obj_00,this_obj,argc,argv);
      uVar2 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
    }
    else {
      JVar3 = js_create_array(ctx,argc,argv);
      if ((int)JVar3.tag == 6) {
        JVar4 = (JSValue)(ZEXT816(6) << 0x40);
        uVar2 = 0;
      }
      else {
        local_68.ptr = *(void **)pJVar1;
        JStack_60 = pJVar1[1];
        func_obj_02.tag = method.tag;
        func_obj_02.u.float64 = method.u.float64;
        local_58 = JVar3;
        local_48 = this_obj;
        JVar4 = JS_Call(ctx,func_obj_02,*(JSValue *)(pJVar1 + 2),3,(JSValue *)&local_68);
        uVar2 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
        if (((int)JVar4.tag != -1) && ((int)JVar4.tag != 6)) {
          JS_FreeValue(ctx,JVar4);
          JS_ThrowTypeErrorNotAnObject(ctx);
          JVar4 = (JSValue)(ZEXT816(6) << 0x40);
          uVar2 = 0;
        }
      }
      v_00.tag = method.tag;
      v_00.u.float64 = method.u.float64;
      JS_FreeValue(ctx,v_00);
      JS_FreeValue(ctx,JVar3);
    }
  }
  JVar3.tag = JVar4.tag;
  JVar3.u.float64 = JVar4.u.float64 | uVar2;
LAB_001299b8:
  JVar5.u.ptr = (void *)((ulong)JVar3.u.ptr & 0xffffffff | uVar2);
  JVar5.tag = JVar3.tag;
  return JVar5;
}

Assistant:

static JSValue js_proxy_call(JSContext *ctx, JSValueConst func_obj,
                             JSValueConst this_obj,
                             int argc, JSValueConst *argv, int flags)
{
    JSProxyData *s;
    JSValue method, arg_array, ret;
    JSValueConst args[3];

    if (flags & JS_CALL_FLAG_CONSTRUCTOR)
        return js_proxy_call_constructor(ctx, func_obj, this_obj, argc, argv);
    
    s = get_proxy_method(ctx, &method, func_obj, JS_ATOM_apply);
    if (!s)
        return JS_EXCEPTION;
    if (!s->is_func) {
        JS_FreeValue(ctx, method);
        return JS_ThrowTypeError(ctx, "not a function");
    }
    if (JS_IsUndefined(method))
        return JS_Call(ctx, s->target, this_obj, argc, argv);
    arg_array = js_create_array(ctx, argc, argv);
    if (JS_IsException(arg_array)) {
        ret = JS_EXCEPTION;
        goto fail;
    }
    args[0] = s->target;
    args[1] = this_obj;
    args[2] = arg_array;
    ret = JS_Call(ctx, method, s->handler, 3, args);
 fail:
    JS_FreeValue(ctx, method);
    JS_FreeValue(ctx, arg_array);
    return ret;
}